

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadSection(CrateReader *this,Section *s)

{
  int64_t *ret;
  StreamReader *pSVar1;
  uint64_t uVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  size_t nbytes;
  size_t __n;
  ostringstream ss_e;
  long *local_1b8;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  pSVar1 = this->_sr;
  uVar2 = pSVar1->idx_;
  __n = 0x10;
  if (pSVar1->length_ < uVar2 + 0x10) {
    __n = pSVar1->length_ - uVar2;
  }
  if (__n - 1 < 0x10) {
    memcpy(s,pSVar1->binary_ + uVar2,__n);
    pSVar1->idx_ = pSVar1->idx_ + __n;
    if (__n == 0x10) {
      ret = &s->start;
      bVar3 = StreamReader::read8(this->_sr,ret);
      if (bVar3) {
        if (this->_sr->length_ < (ulong)*ret) {
          ::std::__cxx11::ostringstream::ostringstream(local_198);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_198,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_198,"ReadSection",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_198,0x1537);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar6 = "Section start offset exceeds USDC file size.";
          lVar5 = 0x2c;
        }
        else {
          bVar3 = StreamReader::read8(this->_sr,&s->size);
          if (!bVar3) goto LAB_001c0b30;
          if ((ulong)(s->size + *ret) <= this->_sr->length_) {
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_198);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_198,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_198,"ReadSection",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_198,0x1540);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar6 = "Section end offset exceeds USDC file size.";
          lVar5 = 0x2a;
        }
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar6,lVar5);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1b8);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_198);
        ::std::ios_base::~ios_base(local_128);
        return false;
      }
    }
  }
LAB_001c0b30:
  ::std::__cxx11::string::append((char *)&this->_err);
  return false;
}

Assistant:

bool CrateReader::ReadSection(crate::Section *s) {
  size_t name_len = crate::kSectionNameMaxLength + 1;

  if (name_len !=
      _sr->read(name_len, name_len, reinterpret_cast<uint8_t *>(s->name))) {
    _err += "Failed to read section.name.\n";
    return false;
  }

  if (!_sr->read8(&s->start)) {
    _err += "Failed to read section.start.\n";
    return false;
  }

  if (size_t(s->start) > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Section start offset exceeds USDC file size.");
  }

  if (!_sr->read8(&s->size)) {
    _err += "Failed to read section.size.\n";
    return false;
  }

  if (size_t(s->start + s->size) > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Section end offset exceeds USDC file size.");
  }


  return true;
}